

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O1

void __thiscall DSDcc::DSDNXDN::processVoiceFrameEFR(DSDNXDN *this,int symbolIndex,int dibit)

{
  uchar *puVar1;
  DSDDecoder *pDVar2;
  int iVar3;
  int iVar4;
  double in_XMM0_Qa;
  
  if ((symbolIndex == 0) && ((this->m_dsdDecoder->m_opts).errorbars == 1)) {
    in_XMM0_Qa = DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
  }
  iVar4 = symbolIndex % 0x48;
  if (this->m_dsdDecoder->m_mbelibEnable == false) {
    iVar3 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    puVar1 = this->m_dsdDecoder->m_mbeDVFrame1 + (iVar3 >> 2);
    *puVar1 = *puVar1 | (byte)(dibit << ((char)(iVar4 % 4) * -2 + 6U & 0x1f));
  }
  if (iVar4 == 0x47) {
    pDVar2 = this->m_dsdDecoder;
    pDVar2->m_mbeDVReady1 = true;
    if ((pDVar2->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar2->m_dsdLogger,in_XMM0_Qa);
      return;
    }
  }
  return;
}

Assistant:

void DSDNXDN::processVoiceFrameEFR(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    storeSymbolDV(symbolIndex % 72, dibit);

    if (symbolIndex % 72 == 71)
    {
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}